

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-threadpool-cancel.c
# Opt level: O1

int run_test_threadpool_cancel_getaddrinfo(void)

{
  int iVar1;
  int iVar2;
  undefined8 uVar3;
  undefined1 *puVar4;
  long extraout_RDX;
  long extraout_RDX_00;
  long extraout_RDX_01;
  ulong *extraout_RDX_02;
  uv_work_t *puVar5;
  uint uVar6;
  ulong *puVar7;
  ulong *in_R11;
  long lVar8;
  long *plVar9;
  long lVar10;
  uv_sem_t *puVar11;
  int64_t eval_b;
  int64_t eval_b_3;
  addrinfo hints;
  cancel_info ci;
  uv_getaddrinfo_t reqs [4];
  undefined1 auStack_2320 [120];
  undefined1 auStack_22a8 [2048];
  undefined8 uStack_1aa8;
  char *pcStack_1aa0;
  code *pcStack_1a98;
  long *plStack_1a90;
  uv_sem_t *puStack_1a88;
  undefined8 uStack_1a80;
  long lStack_1a78;
  code *pcStack_1a70;
  ulong uStack_1a60;
  ulong uStack_1a58;
  undefined1 auStack_1a50 [144];
  undefined1 auStack_19c0 [8];
  long lStack_19b8;
  long *plStack_19b0;
  code *pcStack_19a8;
  undefined8 uStack_1998;
  code *pcStack_1990;
  ulong uStack_1980;
  ulong uStack_1978;
  undefined1 auStack_1970 [16];
  long *plStack_1960;
  undefined8 uStack_1958;
  long alStack_1950 [15];
  long alStack_18d8 [165];
  undefined1 auStack_13b0 [1320];
  undefined1 auStack_e88 [1320];
  undefined1 auStack_960 [1336];
  code *pcStack_428;
  uv_work_t *puStack_420;
  undefined8 uStack_418;
  code *pcStack_410;
  undefined8 uStack_400;
  code *pcStack_3f8;
  undefined8 uStack_3f0;
  long lStack_3e8;
  char acStack_3e0 [72];
  undefined8 uStack_398;
  long local_350 [6];
  undefined1 *local_320;
  undefined8 local_318;
  undefined1 local_310 [120];
  undefined1 local_298 [160];
  undefined1 local_1f8 [160];
  undefined1 local_158 [160];
  undefined1 local_b8 [168];
  
  local_318 = 0xa000000004;
  local_320 = local_298;
  uVar3 = uv_default_loop();
  saturate_threadpool();
  iVar1 = uv_getaddrinfo(uVar3,local_298,getaddrinfo_cb,"fail",0,0);
  local_350[0] = (long)iVar1;
  if (local_350[0] == 0) {
    iVar1 = uv_getaddrinfo(uVar3,local_1f8,getaddrinfo_cb,0,"fail",0);
    local_350[0] = (long)iVar1;
    if (local_350[0] != 0) goto LAB_001d3647;
    iVar1 = uv_getaddrinfo(uVar3,local_158,getaddrinfo_cb,"fail","fail",0);
    local_350[0] = (long)iVar1;
    if (local_350[0] != 0) goto LAB_001d3656;
    iVar1 = uv_getaddrinfo(uVar3,local_b8,getaddrinfo_cb,"fail",0,local_350);
    if (iVar1 != 0) goto LAB_001d3665;
    iVar1 = uv_timer_init(uVar3,local_310);
    if (iVar1 != 0) goto LAB_001d3674;
    iVar1 = uv_timer_start(local_310,timer_cb,10,0);
    if (iVar1 != 0) goto LAB_001d3683;
    iVar1 = uv_run(uVar3,0);
    if (iVar1 != 0) goto LAB_001d3692;
    if (timer_cb_called == 1) {
      uv_walk(uVar3,close_walk_cb,0);
      uv_run(uVar3,0);
      iVar1 = uv_loop_close(uVar3);
      if (iVar1 == 0) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_001d36b0;
    }
  }
  else {
    run_test_threadpool_cancel_getaddrinfo_cold_1();
LAB_001d3647:
    run_test_threadpool_cancel_getaddrinfo_cold_2();
LAB_001d3656:
    run_test_threadpool_cancel_getaddrinfo_cold_3();
LAB_001d3665:
    run_test_threadpool_cancel_getaddrinfo_cold_4();
LAB_001d3674:
    run_test_threadpool_cancel_getaddrinfo_cold_5();
LAB_001d3683:
    run_test_threadpool_cancel_getaddrinfo_cold_6();
LAB_001d3692:
    run_test_threadpool_cancel_getaddrinfo_cold_7();
  }
  run_test_threadpool_cancel_getaddrinfo_cold_8();
LAB_001d36b0:
  run_test_threadpool_cancel_getaddrinfo_cold_9();
  iVar1 = (int)&uStack_3f0;
  lVar8 = 0;
  pcStack_3f8 = (code *)0x1d36f0;
  uStack_398 = uVar3;
  snprintf(acStack_3e0,0x40,"UV_THREADPOOL_SIZE=%lu",4);
  pcStack_3f8 = (code *)0x1d36f8;
  putenv(acStack_3e0);
  puVar5 = pause_reqs;
  pcStack_3f8 = (code *)0x1d3704;
  uVar3 = uv_default_loop();
  while( true ) {
    pcStack_3f8 = (code *)0x1d372c;
    iVar2 = uv_sem_init((long)pause_sems + lVar8,0);
    lStack_3e8 = (long)iVar2;
    uStack_3f0 = 0;
    if (lStack_3e8 != 0) break;
    pcStack_3f8 = (code *)0x1d3757;
    iVar2 = uv_queue_work(uVar3,puVar5,work_cb,done_cb);
    lStack_3e8 = (long)iVar2;
    uStack_3f0 = 0;
    if (lStack_3e8 != 0) {
      pcStack_3f8 = (code *)0x1d3799;
      saturate_threadpool_cold_2();
      break;
    }
    lVar8 = lVar8 + 0x20;
    puVar5 = puVar5 + 1;
    lStack_3e8 = 0;
    if (lVar8 == 0x80) {
      return iVar2;
    }
  }
  pcStack_3f8 = getaddrinfo_cb;
  saturate_threadpool_cold_1();
  pcStack_3f8 = (code *)(long)iVar1;
  uStack_400 = 0xfffffffffffff445;
  if (pcStack_3f8 == (code *)0xfffffffffffff445) {
    lVar8 = extraout_RDX;
    if (extraout_RDX == 0) {
      iVar1 = uv_freeaddrinfo(0);
      return iVar1;
    }
  }
  else {
    pcStack_410 = (code *)0x1d37e6;
    getaddrinfo_cb_cold_1();
    lVar8 = extraout_RDX_00;
  }
  pcStack_410 = timer_cb;
  getaddrinfo_cb_cold_2();
  pcStack_410 = (code *)0x80;
  puStack_420 = puVar5;
  uStack_418 = uVar3;
  if (*(int *)(lVar8 + -8) == 0) {
LAB_001d3836:
    lVar10 = 0;
    pcStack_428 = (code *)0x1d3843;
    uv_close(lVar8,0);
    do {
      pcStack_428 = (code *)0x1d3853;
      iVar1 = uv_sem_post((long)pause_sems + lVar10);
      lVar10 = lVar10 + 0x20;
    } while (lVar10 != 0x80);
    timer_cb_called = timer_cb_called + 1;
    return iVar1;
  }
  uVar6 = 0;
  plVar9 = (long *)0x1ab81de;
LAB_001d3803:
  puVar4 = (undefined1 *)(ulong)(*(int *)(lVar8 + -4) * uVar6);
  if (((*(int *)(puVar4 + *(long *)(lVar8 + -0x10) + 0x10) != 6) ||
      (0x18 < *(uint *)(puVar4 + *(long *)(lVar8 + -0x10) + 0x48))) ||
     ((0x1ab81deU >> (*(uint *)(puVar4 + *(long *)(lVar8 + -0x10) + 0x48) & 0x1f) & 1) == 0)) {
    pcStack_428 = (code *)0x1d382b;
    iVar1 = uv_cancel();
    if (iVar1 != 0) {
      pcStack_428 = run_test_threadpool_cancel_getnameinfo;
      timer_cb_cold_1();
      pcStack_428 = (code *)0x1ab81de;
      pcStack_1990 = (code *)0x1d3890;
      iVar1 = uv_ip4_addr("127.0.0.1",0x50,auStack_1970);
      alStack_18d8[0] = (long)iVar1;
      plStack_1960 = (long *)0x0;
      if (alStack_18d8[0] == 0) {
        plVar9 = alStack_18d8;
        uStack_1958 = 0x52800000004;
        pcStack_1990 = (code *)0x1d38d7;
        plStack_1960 = plVar9;
        lVar8 = uv_default_loop();
        pcStack_1990 = (code *)0x1d38df;
        saturate_threadpool();
        puVar4 = auStack_1970;
        pcStack_1990 = (code *)0x1d38f9;
        iVar1 = uv_getnameinfo(lVar8,plVar9,getnameinfo_cb,puVar4,0);
        uStack_1978 = (ulong)iVar1;
        uStack_1980 = 0;
        if (uStack_1978 != 0) goto LAB_001d3af1;
        puVar4 = auStack_1970;
        pcStack_1990 = (code *)0x1d3938;
        iVar1 = uv_getnameinfo(lVar8,auStack_13b0,getnameinfo_cb,puVar4,0);
        uStack_1978 = (ulong)iVar1;
        uStack_1980 = 0;
        if (uStack_1978 != 0) goto LAB_001d3b00;
        puVar4 = auStack_1970;
        pcStack_1990 = (code *)0x1d3977;
        iVar1 = uv_getnameinfo(lVar8,auStack_e88,getnameinfo_cb,puVar4,0);
        uStack_1978 = (ulong)iVar1;
        uStack_1980 = 0;
        if (uStack_1978 != 0) goto LAB_001d3b0f;
        puVar4 = auStack_1970;
        pcStack_1990 = (code *)0x1d39b6;
        iVar1 = uv_getnameinfo(lVar8,auStack_960,getnameinfo_cb,puVar4,0);
        uStack_1978 = (ulong)iVar1;
        uStack_1980 = 0;
        if (uStack_1978 != 0) goto LAB_001d3b1e;
        plVar9 = alStack_1950;
        pcStack_1990 = (code *)0x1d39e6;
        iVar1 = uv_timer_init(lVar8,plVar9);
        uStack_1978 = (ulong)iVar1;
        uStack_1980 = 0;
        if (uStack_1978 != 0) goto LAB_001d3b2d;
        puVar4 = (undefined1 *)0x0;
        pcStack_1990 = (code *)0x1d3a1c;
        iVar1 = uv_timer_start(plVar9,timer_cb,10);
        uStack_1978 = (ulong)iVar1;
        uStack_1980 = 0;
        if (uStack_1978 != 0) goto LAB_001d3b3c;
        pcStack_1990 = (code *)0x1d3a46;
        iVar1 = uv_run(lVar8,0);
        uStack_1978 = (ulong)iVar1;
        uStack_1980 = 0;
        if (uStack_1978 != 0) goto LAB_001d3b4b;
        uStack_1978 = 1;
        uStack_1980 = (ulong)timer_cb_called;
        if (uStack_1980 != 1) goto LAB_001d3b5a;
        pcStack_1990 = (code *)0x1d3a9b;
        uv_walk(lVar8,close_walk_cb,0);
        pcStack_1990 = (code *)0x1d3aa5;
        uv_run(lVar8,0);
        uStack_1978 = 0;
        pcStack_1990 = (code *)0x1d3ab6;
        iVar1 = uv_loop_close(lVar8);
        uStack_1980 = (ulong)iVar1;
        if (uStack_1978 == uStack_1980) {
          pcStack_1990 = (code *)0x1d3ad2;
          uv_library_shutdown();
          return 0;
        }
      }
      else {
        pcStack_1990 = (code *)0x1d3af1;
        run_test_threadpool_cancel_getnameinfo_cold_1();
LAB_001d3af1:
        pcStack_1990 = (code *)0x1d3b00;
        run_test_threadpool_cancel_getnameinfo_cold_2();
LAB_001d3b00:
        pcStack_1990 = (code *)0x1d3b0f;
        run_test_threadpool_cancel_getnameinfo_cold_3();
LAB_001d3b0f:
        pcStack_1990 = (code *)0x1d3b1e;
        run_test_threadpool_cancel_getnameinfo_cold_4();
LAB_001d3b1e:
        pcStack_1990 = (code *)0x1d3b2d;
        run_test_threadpool_cancel_getnameinfo_cold_5();
LAB_001d3b2d:
        pcStack_1990 = (code *)0x1d3b3c;
        run_test_threadpool_cancel_getnameinfo_cold_6();
LAB_001d3b3c:
        pcStack_1990 = (code *)0x1d3b4b;
        run_test_threadpool_cancel_getnameinfo_cold_7();
LAB_001d3b4b:
        pcStack_1990 = (code *)0x1d3b5a;
        run_test_threadpool_cancel_getnameinfo_cold_8();
LAB_001d3b5a:
        pcStack_1990 = (code *)0x1d3b69;
        run_test_threadpool_cancel_getnameinfo_cold_9();
      }
      iVar1 = (int)&uStack_1980;
      pcStack_1990 = getnameinfo_cb;
      run_test_threadpool_cancel_getnameinfo_cold_10();
      pcStack_1990 = (code *)(long)iVar1;
      uStack_1998 = 0xfffffffffffff445;
      if (pcStack_1990 == (code *)0xfffffffffffff445) {
        if (extraout_RDX_01 != 0) goto LAB_001d3bb7;
        if (puVar4 == (undefined1 *)0x0) {
          return iVar1;
        }
      }
      else {
        pcStack_19a8 = (code *)0x1d3bb7;
        getnameinfo_cb_cold_1();
LAB_001d3bb7:
        pcStack_19a8 = (code *)0x1d3bbf;
        getnameinfo_cb_cold_2();
      }
      pcStack_19a8 = run_test_threadpool_cancel_random;
      getnameinfo_cb_cold_3();
      pcStack_19a8 = work_cb;
      pcStack_1a70 = (code *)0x1d3bd8;
      lStack_19b8 = lVar8;
      plStack_19b0 = plVar9;
      saturate_threadpool();
      pcStack_1a70 = (code *)0x1d3bdd;
      uVar3 = uv_default_loop();
      lVar8 = 1;
      pcStack_1a70 = (code *)0x1d3c04;
      iVar1 = uv_random(uVar3,auStack_1a50,auStack_19c0,1,0,nop_random_cb);
      uStack_1a58 = (ulong)iVar1;
      uStack_1a60 = 0;
      if (uStack_1a58 == 0) {
        pcStack_1a70 = (code *)0x1d3c2e;
        iVar1 = uv_cancel(auStack_1a50);
        uStack_1a58 = (ulong)iVar1;
        uStack_1a60 = 0;
        if (uStack_1a58 != 0) goto LAB_001d3d42;
        uStack_1a58 = (ulong)done_cb_called;
        uStack_1a60 = 0;
        if (uStack_1a58 == 0) {
          lVar10 = 0;
          puVar11 = pause_sems;
          uStack_1a58 = 0;
          do {
            pcStack_1a70 = (code *)0x1d3c85;
            uv_sem_post((long)pause_sems + lVar10);
            lVar10 = lVar10 + 0x20;
          } while (lVar10 != 0x80);
          pcStack_1a70 = (code *)0x1d3c9c;
          iVar1 = uv_run(uVar3,0);
          uStack_1a58 = (ulong)iVar1;
          uStack_1a60 = 0;
          plVar9 = (long *)0x80;
          if (uStack_1a58 == 0) {
            uStack_1a58 = 1;
            uStack_1a60 = (ulong)done_cb_called;
            if (uStack_1a60 != 1) goto LAB_001d3d6f;
            pcStack_1a70 = (code *)0x1d3cf1;
            uv_walk(uVar3,close_walk_cb,0);
            pcStack_1a70 = (code *)0x1d3cfb;
            uv_run(uVar3,0);
            uStack_1a58 = 0;
            pcStack_1a70 = (code *)0x1d3d0c;
            iVar1 = uv_loop_close(uVar3);
            uStack_1a60 = (ulong)iVar1;
            if (uStack_1a58 == uStack_1a60) {
              pcStack_1a70 = (code *)0x1d3d24;
              uv_library_shutdown();
              return 0;
            }
          }
          else {
LAB_001d3d60:
            pcStack_1a70 = (code *)0x1d3d6f;
            run_test_threadpool_cancel_random_cold_4();
LAB_001d3d6f:
            pcStack_1a70 = (code *)0x1d3d7e;
            run_test_threadpool_cancel_random_cold_5();
          }
          puVar7 = &uStack_1a58;
          iVar1 = (int)&uStack_1a60;
          pcStack_1a70 = nop_random_cb;
          run_test_threadpool_cancel_random_cold_6();
          lStack_1a78 = (long)iVar1;
          uStack_1a80 = 0xffffffffffffff83;
          pcStack_1a70 = (code *)uVar3;
          if (lStack_1a78 != -0x7d) {
            puStack_1a88 = (uv_sem_t *)0x1d3df0;
            nop_random_cb_cold_1();
LAB_001d3df0:
            plStack_1a90 = (long *)0x1e42c5;
            pcStack_1aa0 = "(void*) ri->buf";
            uStack_1aa8 = 0x1d3e30;
            puStack_1a88 = (uv_sem_t *)in_R11;
            fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-threadpool-cancel.c"
                    ,0xc1,"buf");
            puStack_1a88 = (uv_sem_t *)0x1d3e39;
            abort();
          }
          in_R11 = puVar7 + 0x12;
          if (in_R11 != extraout_RDX_02) goto LAB_001d3df0;
          uStack_1a80 = 1;
          if (lVar8 == 1) {
            done_cb_called = done_cb_called + 1;
            return 1;
          }
          puStack_1a88 = (uv_sem_t *)run_test_threadpool_cancel_work;
          lStack_1a78 = lVar8;
          nop_random_cb_cold_2();
          pcStack_1a98 = done_cb;
          pcStack_1aa0 = (char *)uVar3;
          plStack_1a90 = plVar9;
          puStack_1a88 = puVar11;
          uVar3 = uv_default_loop();
          saturate_threadpool();
          lVar8 = 0;
          do {
            iVar1 = uv_queue_work(uVar3,auStack_22a8 + lVar8,work2_cb,done2_cb);
            if (iVar1 != 0) {
              run_test_threadpool_cancel_work_cold_1();
LAB_001d4010:
              run_test_threadpool_cancel_work_cold_2();
LAB_001d401f:
              run_test_threadpool_cancel_work_cold_3();
LAB_001d402e:
              run_test_threadpool_cancel_work_cold_4();
LAB_001d403d:
              run_test_threadpool_cancel_work_cold_5();
              goto LAB_001d404c;
            }
            lVar8 = lVar8 + 0x80;
          } while (lVar8 != 0x800);
          iVar1 = uv_timer_init(uVar3,auStack_2320);
          if (iVar1 != 0) goto LAB_001d4010;
          iVar1 = uv_timer_start(auStack_2320,timer_cb,10,0);
          if (iVar1 != 0) goto LAB_001d401f;
          iVar1 = uv_run(uVar3,0);
          if (iVar1 != 0) goto LAB_001d402e;
          if (timer_cb_called != 1) goto LAB_001d403d;
          if (done2_cb_called == 0x10) {
            uv_walk(uVar3,close_walk_cb,0);
            uv_run(uVar3,0);
            iVar1 = uv_loop_close(uVar3);
            if (iVar1 == 0) {
              uv_library_shutdown();
              return 0;
            }
            goto LAB_001d405b;
          }
LAB_001d404c:
          run_test_threadpool_cancel_work_cold_6();
LAB_001d405b:
          run_test_threadpool_cancel_work_cold_7();
          fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-threadpool-cancel.c"
                  ,0x99,"0 && \"work2_cb called\"");
          abort();
        }
      }
      else {
        pcStack_1a70 = (code *)0x1d3d42;
        run_test_threadpool_cancel_random_cold_1();
LAB_001d3d42:
        pcStack_1a70 = (code *)0x1d3d51;
        run_test_threadpool_cancel_random_cold_2();
      }
      pcStack_1a70 = (code *)0x1d3d60;
      run_test_threadpool_cancel_random_cold_3();
      puVar11 = (uv_sem_t *)work_cb;
      goto LAB_001d3d60;
    }
  }
  uVar6 = uVar6 + 1;
  if (*(uint *)(lVar8 + -8) <= uVar6) goto LAB_001d3836;
  goto LAB_001d3803;
}

Assistant:

TEST_IMPL(threadpool_cancel_getaddrinfo) {
  uv_getaddrinfo_t reqs[4];
  struct cancel_info ci;
  struct addrinfo hints;
  uv_loop_t* loop;
  int r;

  INIT_CANCEL_INFO(&ci, reqs);
  loop = uv_default_loop();
  saturate_threadpool();

  r = uv_getaddrinfo(loop, reqs + 0, getaddrinfo_cb, "fail", NULL, NULL);
  ASSERT_OK(r);

  r = uv_getaddrinfo(loop, reqs + 1, getaddrinfo_cb, NULL, "fail", NULL);
  ASSERT_OK(r);

  r = uv_getaddrinfo(loop, reqs + 2, getaddrinfo_cb, "fail", "fail", NULL);
  ASSERT_OK(r);

  r = uv_getaddrinfo(loop, reqs + 3, getaddrinfo_cb, "fail", NULL, &hints);
  ASSERT_OK(r);

  ASSERT_OK(uv_timer_init(loop, &ci.timer_handle));
  ASSERT_OK(uv_timer_start(&ci.timer_handle, timer_cb, 10, 0));
  ASSERT_OK(uv_run(loop, UV_RUN_DEFAULT));
  ASSERT_EQ(1, timer_cb_called);

  MAKE_VALGRIND_HAPPY(loop);
  return 0;
}